

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O0

bool __thiscall
opts::BasicOption::parse(BasicOption *this,int argc,char **argv,int *i,int j,IsShort *is_short)

{
  byte bVar1;
  ostream *poVar2;
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  int in_R8D;
  bool result;
  char *cur_arg;
  char *argument;
  IsShort *in_stack_ffffffffffffff18;
  char *pcVar3;
  function<bool_(char)> *in_stack_ffffffffffffff20;
  allocator *paVar4;
  bool local_ba;
  bool local_b9;
  allocator local_a1;
  string local_a0 [35];
  byte local_7d;
  byte local_69;
  char *local_48;
  char *local_40;
  int local_2c;
  int *local_28;
  long local_20;
  
  local_48 = *(char **)(in_RDX + (long)*in_RCX * 8);
  local_28 = in_RCX;
  local_20 = in_RDX;
  if (*(char *)(*(long *)(in_RDX + (long)*in_RCX * 8) + (long)in_R8D) == '\0') {
    local_69 = 0;
    local_b9 = false;
    if (*in_RCX + 1 < in_ESI) {
      local_ba = true;
      if (**(char **)(in_RDX + (long)(*in_RCX + 1) * 8) == '-') {
        std::function<bool_(char)>::function(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        local_69 = 1;
        local_ba = Options::dashed_non_option
                             ((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      local_b9 = local_ba;
    }
    if ((local_69 & 1) != 0) {
      std::function<bool_(char)>::~function((function<bool_(char)> *)0x182a9b);
    }
    if (local_b9 == false) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"error: cannot find the argument; ignoring ");
      poVar2 = std::operator<<(poVar2,*(char **)(local_20 + (long)*local_28 * 8));
      std::operator<<(poVar2,'\n');
      return false;
    }
    *local_28 = *local_28 + 1;
    local_40 = *(char **)(local_20 + (long)*local_28 * 8);
  }
  else if (*(char *)(*(long *)(in_RDX + (long)*in_RCX * 8) + (long)in_R8D) == '=') {
    local_40 = (char *)(*(long *)(in_RDX + (long)*in_RCX * 8) + (long)(in_R8D + 1));
  }
  else {
    if (in_R8D != 2) {
      local_2c = in_R8D;
      poVar2 = std::operator<<((ostream *)&std::cerr,"error: unexpected character \'");
      poVar2 = std::operator<<(poVar2,*(char *)(*(long *)(local_20 + (long)*local_28 * 8) +
                                               (long)local_2c));
      poVar2 = std::operator<<(poVar2,"\' ignoring ");
      poVar2 = std::operator<<(poVar2,*(char **)(local_20 + (long)*local_28 * 8));
      std::operator<<(poVar2,'\n');
      return false;
    }
    local_40 = (char *)(*(long *)(in_RDX + (long)*in_RCX * 8) + 2);
  }
  paVar4 = &local_a1;
  pcVar3 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,pcVar3,paVar4);
  bVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_7d = bVar1 & 1;
  if (local_7d == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"error: failed to parse ");
    poVar2 = std::operator<<(poVar2,local_40);
    poVar2 = std::operator<<(poVar2," in ");
    poVar2 = std::operator<<(poVar2,local_48);
    std::operator<<(poVar2,'\n');
  }
  return (bool)(local_7d & 1);
}

Assistant:

bool
BasicOption::parse(int argc, char** argv, int& i, int j, IsShort is_short)
{
    char* argument;
    char* cur_arg = argv[i];
    // -v...
    if (argv[i][j] == '\0')
    {
        // -v data
        if (i + 1 < argc && (argv[i+1][0] != '-' || Options::dashed_non_option(argv[i+1], is_short)))
        {
            ++i;
            argument = argv[i];
        } else
        {
            std::cerr << "error: cannot find the argument; ignoring " << argv[i] << '\n';
            return false;
        }
    } else if (argv[i][j] == '=')
    {
        // -v=data
        argument = &argv[i][j+1];
    } else if( j == 2 ) { // only for short options
        // -vdata
        argument = &argv[i][j];
    } else
    {
        std::cerr << "error: unexpected character \'" << argv[i][j] << "\' ignoring " << argv[i] << '\n';
        return false;
    }
    bool result = set(argument);
    if (!result)
        std::cerr << "error: failed to parse " << argument << " in " << cur_arg << '\n';
    return result;
}